

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMesh.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChMesh::KRMmatricesLoad(ChMesh *this,double Kfactor,double Rfactor,double Mfactor)

{
  rep_conflict rVar1;
  pointer psVar2;
  long lVar3;
  ulong uVar4;
  
  rVar1 = std::chrono::_V2::system_clock::now();
  (this->timer_KRMload).m_start.__d.__r = rVar1;
  psVar2 = (this->velements).
           super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->velements).
      super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar2) {
    lVar3 = 0;
    uVar4 = 0;
    do {
      (**(code **)(**(long **)((long)&(psVar2->
                                      super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr + lVar3) + 0x90))(Kfactor,Rfactor,Mfactor);
      uVar4 = uVar4 + 1;
      psVar2 = (this->velements).
               super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x10;
    } while (uVar4 < (ulong)((long)(this->velements).
                                   super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4));
  }
  lVar3 = std::chrono::_V2::system_clock::now();
  (this->timer_KRMload).m_end.__d.__r = lVar3;
  (this->timer_KRMload).m_total.__r =
       (double)(lVar3 - (this->timer_KRMload).m_start.__d.__r) / 1000000000.0 +
       (this->timer_KRMload).m_total.__r;
  this->ncalls_KRMload = this->ncalls_KRMload + 1;
  return;
}

Assistant:

void ChMesh::KRMmatricesLoad(double Kfactor, double Rfactor, double Mfactor) {
    int nthreads = GetSystem()->nthreads_chrono;

    timer_KRMload.start();
#pragma omp parallel for num_threads(nthreads)
    for (int ie = 0; ie < velements.size(); ie++)
        velements[ie]->KRMmatricesLoad(Kfactor, Rfactor, Mfactor);
    timer_KRMload.stop();
    ncalls_KRMload++;
}